

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyDiscardElement(TidyDocImpl *doc,Node *element)

{
  Node *local_20;
  Node *next;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  local_20 = (Node *)0x0;
  if (element != (Node *)0x0) {
    local_20 = element->next;
    prvTidyRemoveNode(element);
    prvTidyFreeNode(doc,element);
  }
  return local_20;
}

Assistant:

Node *TY_(DiscardElement)( TidyDocImpl* doc, Node *element )
{
    Node *next = NULL;

    if (element)
    {
        next = element->next;
        TY_(RemoveNode)(element);
        TY_(FreeNode)( doc, element);
    }

    return next;
}